

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateBlock(ExpressionEvalContext *ctx,ExprBlock *expression)

{
  StackFrame *pSVar1;
  bool bVar2;
  StackFrame **ppSVar3;
  ExprBase *pEVar4;
  ExprBase *local_30;
  ExprBase *value;
  StackFrame *frame;
  ExprBlock *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar2 = AddInstruction(ctx);
  if (bVar2) {
    ppSVar3 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
    pSVar1 = *ppSVar3;
    for (local_30 = (expression->expressions).head; local_30 != (ExprBase *)0x0;
        local_30 = local_30->next) {
      pEVar4 = Evaluate(ctx,local_30);
      if (pEVar4 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      if (((pSVar1->continueDepth != 0) || (pSVar1->breakDepth != 0)) ||
         (pSVar1->returnValue != (ExprBase *)0x0)) {
        pEVar4 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
        ExprVoid::ExprVoid((ExprVoid *)pEVar4,(expression->super_ExprBase).source,ctx->ctx->typeVoid
                          );
        pEVar4 = CheckType(&expression->super_ExprBase,pEVar4);
        return pEVar4;
      }
    }
    if ((expression->closures == (ExprBase *)0x0) ||
       (pEVar4 = Evaluate(ctx,expression->closures), pEVar4 != (ExprBase *)0x0)) {
      pEVar4 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
      ExprVoid::ExprVoid((ExprVoid *)pEVar4,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
      ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,pEVar4);
    }
    else {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateBlock(ExpressionEvalContext &ctx, ExprBlock *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		if(!Evaluate(ctx, value))
			return NULL;

		if(frame->continueDepth || frame->breakDepth || frame->returnValue)
			return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
	}

	if(expression->closures)
	{
		if(!Evaluate(ctx, expression->closures))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}